

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SizeFunction::SizeFunction(SizeFunction *this)

{
  allocator<char> local_31;
  string local_30;
  SizeFunction *local_10;
  SizeFunction *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"$size",&local_31);
  ArrayQueryFunction::SystemSubroutine(&this->super_ArrayQueryFunction,&local_30,Function);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_ArrayQueryFunction).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SizeFunction_00916c08;
  return;
}

Assistant:

ConstantValue LowFunction::eval(EvalContext& context, const Args& args, SourceRange,
                                const CallExpression::SystemCallInfo&) const {
    DimResult dim = getDim(context, args);
    if (dim.hardFail)
        return nullptr;

    if (dim.outOfRange)
        return SVInt::createFillX(32, true);

    if (dim.isDynamic)
        return SVInt(32, 0, true);

    // For associative arrays, $low returns the first key, or 'x if no elements.
    if (dim.indexType) {
        if (dim.map.empty())
            return SVInt::createFillX(dim.indexType->getBitWidth(), dim.indexType->isSigned());
        return dim.map.begin()->first;
    }

    return SVInt(32, uint64_t(dim.range.lower()), true);
}